

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86regalloc.cpp
# Opt level: O0

Error __thiscall asmjit::X86RAPass::translate(X86RAPass *this)

{
  uint uVar1;
  X86RAPass *pXVar2;
  CodeEmitter *pCVar3;
  undefined8 uVar4;
  Zone *pZVar5;
  _func_int **pp_Var6;
  long lVar7;
  X86RAPass *pXVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  Error EVar13;
  Error EVar14;
  Error EVar15;
  Error EVar16;
  uint32_t *puVar17;
  uint8_t *puVar18;
  FuncFrameLayout *in_RDI;
  Error _err_8;
  Error _err_7;
  Error _err_6;
  Error _err_5;
  FuncFrameLayout layout;
  Error _err_4;
  Error _err_3;
  Error _err_2;
  RAState *savedState_1;
  RAState *savedState;
  CBNode *jNext;
  CBLabel *jTarget;
  CBJump *node_2;
  Error _err_1;
  Error _err;
  VirtReg *vreg;
  TiedReg *tied;
  uint32_t i;
  uint32_t tiedTotal;
  TiedReg *tiedArray;
  RABits *liveness;
  X86RAData *raData;
  CBLabel *node_1;
  CBNode *jFlow;
  CBLabel *node;
  Link *jLink;
  CBNode *stop;
  CBNode *next;
  CBNode *node_;
  X86CallAlloc cAlloc;
  X86VarAlloc vAlloc;
  CCFunc *func;
  X86Compiler *cc;
  CBNode *in_stack_000009e8;
  X86VarAlloc *in_stack_000009f0;
  CCFuncCall *in_stack_00000c08;
  X86CallAlloc *in_stack_00000c10;
  undefined4 in_stack_fffffffffffffa0c;
  CBLabel *in_stack_fffffffffffffa38;
  CBJump *in_stack_fffffffffffffa40;
  X86RAPass *in_stack_fffffffffffffa48;
  undefined4 in_stack_fffffffffffffa58;
  undefined4 in_stack_fffffffffffffa5c;
  uint in_stack_fffffffffffffa60;
  uint8_t in_stack_fffffffffffffa68;
  uint8_t in_stack_fffffffffffffa69;
  undefined6 in_stack_fffffffffffffa6a;
  uint32_t local_57c;
  CCFunc *in_stack_fffffffffffffa88;
  X86RAPass *in_stack_fffffffffffffa90;
  X86RAPass *in_stack_fffffffffffffa98;
  uint local_508;
  undefined8 *local_4d0;
  X86RAPass *local_4c0;
  X86RAPass *local_4b8;
  undefined1 local_4a0 [8];
  undefined8 local_498;
  undefined1 local_440 [8];
  undefined8 local_438;
  X86RAPass *local_3e0;
  long local_3d8;
  X86RAPass *local_398;
  X86RAPass *local_390;
  X86RAPass *local_388;
  X86RAPass *local_380;
  X86RAPass *local_378;
  uint32_t *local_370;
  undefined8 *local_368;
  long local_360;
  X86RAPass *local_358;
  undefined8 *local_350;
  long local_348;
  X86RAPass *local_340;
  X86RAPass *local_338;
  X86RAPass *local_330;
  X86RAPass *local_328;
  X86RAPass *local_320;
  X86RAPass *local_318;
  X86RAPass *local_310;
  X86RAPass *local_308;
  X86RAPass *local_300;
  X86RAPass *local_2f8;
  long local_2f0;
  X86RAPass *local_2e8;
  long local_2e0;
  X86RAPass *local_2d8;
  X86RAPass *local_2d0;
  X86RAPass *local_2c8;
  long local_2c0;
  X86RAPass *local_2b8;
  X86RAPass *local_2b0;
  X86RAPass *local_2a8;
  X86RAPass *local_2a0;
  X86RAPass *local_298;
  X86RAPass *local_290;
  X86RAPass *local_288;
  anon_union_8_2_78723da6_for_MemData_2 local_280;
  long local_278;
  X86RAPass *local_270;
  long local_268;
  X86RAPass *local_260;
  long local_258;
  _func_int **local_250;
  long local_248;
  _func_int **local_240;
  long local_238;
  _func_int **local_230;
  long local_228;
  undefined1 *local_218;
  FuncFrameLayout *msg;
  undefined1 *puVar19;
  int line;
  X86RAPass *in_stack_fffffffffffffe00;
  X86RAPass *file;
  
  local_3d8 = *(long *)(in_RDI->_savedRegs + 1);
  local_4b8 = *(X86RAPass **)(in_RDI[2]._savedRegs + 1);
  local_218 = local_440;
  local_438 = *(undefined8 *)(in_RDI->_savedRegs + 1);
  puVar19 = local_4a0;
  local_498 = *(undefined8 *)(in_RDI->_savedRegs + 1);
  pXVar2 = *(X86RAPass **)(in_RDI[2]._savedRegs + 3);
  local_370 = in_RDI[3]._savedRegs;
  local_4d0 = *(undefined8 **)local_370;
  local_3e0 = local_4b8;
  msg = in_RDI;
  do {
    if (((ulong)(local_4b8->super_RAPass).super_CBPass._name & 0x10000) == 0) goto LAB_001c0ecf;
    local_310 = local_4b8;
    if (*(char *)&(local_4b8->super_RAPass).super_CBPass._name == '\x04') {
      local_230 = (local_4b8->super_RAPass).super_CBPass._vptr_CBPass;
      local_228 = local_3d8;
      *(_func_int ***)(local_3d8 + 0x180) = local_230;
      pCVar3 = (CodeEmitter *)(local_4b8->super_RAPass)._heap._zone;
      uVar4._0_4_ = (pCVar3->_codeInfo)._archInfo;
      uVar4._4_4_ = (pCVar3->_codeInfo).field_1;
      (**(code **)(*(long *)in_RDI + 0x40))(in_RDI,uVar4);
    }
LAB_001c0cc3:
    do {
      do {
        if (local_4d0 == (undefined8 *)0x0) {
          EVar13 = (**(code **)(*(long *)in_RDI + 0x50))();
          if (EVar13 != 0) {
            return EVar13;
          }
          EVar14 = X86RAPass_prepareFuncFrame(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
          if (EVar14 != 0) {
            return EVar14;
          }
          local_290 = local_3e0;
          local_398 = local_3e0;
          EVar15 = FuncFrameLayout::init
                             ((FuncFrameLayout *)&stack0xfffffffffffffa68,
                              (EVP_PKEY_CTX *)((local_3e0->super_RAPass)._heap._slots + 2));
          if (EVar15 != 0) {
            return EVar15;
          }
          *(uint8_t *)((long)&in_RDI[0xb]._gpStackOffset + 1) = in_stack_fffffffffffffa69;
          in_RDI[0xb]._vecStackOffset = local_57c;
          EVar15 = X86RAPass_patchFuncMem
                             ((X86RAPass *)
                              CONCAT62(in_stack_fffffffffffffa6a,
                                       CONCAT11(in_stack_fffffffffffffa69,in_stack_fffffffffffffa68)
                                      ),(CCFunc *)(ulong)in_stack_fffffffffffffa60,
                              (CBNode *)
                              CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),in_RDI);
          if (EVar15 != 0) {
            return EVar15;
          }
          local_268 = local_3d8;
          local_270 = local_3e0;
          *(X86RAPass **)(local_3d8 + 0x180) = local_3e0;
          EVar16 = FuncUtils::emitProlog
                             ((CodeEmitter *)CONCAT44(in_stack_fffffffffffffa0c,EVar13),
                              (FuncFrameLayout *)((ulong)EVar14 << 0x20));
          if (EVar16 != 0) {
            return EVar16;
          }
          local_308 = local_3e0;
          local_280 = (local_3e0->_zsp).super_X86Reg.super_Reg.super_Operand.super_Operand_.field_0.
                      _mem.field_2;
          local_278 = local_3d8;
          *(anon_union_8_2_78723da6_for_MemData_2 *)(local_3d8 + 0x180) = local_280;
          EVar13 = FuncUtils::emitEpilog
                             ((CodeEmitter *)CONCAT44(in_stack_fffffffffffffa0c,EVar13),
                              (FuncFrameLayout *)CONCAT44(EVar14,EVar15));
          if (EVar13 != 0) {
            return EVar13;
          }
          return 0;
        }
        local_350 = local_4d0;
        local_360 = local_4d0[1];
        local_368 = local_4d0;
        local_4d0 = (undefined8 *)*local_4d0;
        if ((*(ushort *)(local_360 + 0x12) & 0x40) == 0) {
          local_358 = *(X86RAPass **)(local_360 + 0x48);
          local_2e0 = local_360;
        }
        else {
          local_358 = *(X86RAPass **)(local_360 + 8);
          local_348 = local_360;
        }
        local_4b8 = local_358;
        in_stack_fffffffffffffa48 = local_358;
        local_2c0 = local_360;
        (**(code **)(*(long *)in_RDI + 0x30))
                  (in_RDI,*(undefined8 *)(*(long *)(local_360 + 0x20) + 8));
        local_378 = local_4b8;
      } while ((((local_4b8->super_RAPass)._heap._zone != (Zone *)0x0) &&
               (((local_4b8->super_RAPass)._heap._zone)->_end != (uint8_t *)0x0)) &&
              (X86RAPass_translateJump
                         (in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,
                          in_stack_fffffffffffffa38),
              ((ulong)(local_4b8->super_RAPass).super_CBPass._name & 0x10000) != 0));
LAB_001c0ecf:
      local_338 = local_4b8;
      local_4c0 = (X86RAPass *)(local_4b8->super_RAPass).super_CBPass._cb;
      *(ushort *)((long)&(local_4b8->super_RAPass).super_CBPass._name + 2) =
           *(ushort *)((long)&(local_4b8->super_RAPass).super_CBPass._name + 2) | 1;
      local_380 = local_4b8;
      if ((local_4b8->super_RAPass)._heap._zone != (Zone *)0x0) {
        local_318 = local_4b8;
        in_stack_fffffffffffffa40 =
             (CBJump *)(ulong)(*(byte *)&(local_4b8->super_RAPass).super_CBPass._name - 1);
        switch(in_stack_fffffffffffffa40) {
        case (CBJump *)0x0:
        case (CBJump *)0xf:
        case (CBJump *)0x11:
        case (CBJump *)0x12:
          if (((ulong)(local_4b8->super_RAPass).super_CBPass._name & 0x200000) == 0) {
            local_288 = local_4b8;
            pZVar5 = (local_4b8->super_RAPass)._heap._zone;
            if (((pZVar5 != (Zone *)0x0) && (local_4c0 != (X86RAPass *)0x0)) &&
               ((local_388 = local_4c0,
                (CodeEmitter *)(local_4c0->super_RAPass)._heap._zone != (CodeEmitter *)0x0 &&
                (pp_Var6 = ((CodeEmitter *)(local_4c0->super_RAPass)._heap._zone)->_vptr_CodeEmitter
                , pp_Var6 != (_func_int **)0x0)))) {
              uVar1 = *(uint *)&pZVar5->_block;
              for (local_508 = 0; local_508 < uVar1; local_508 = local_508 + 1) {
                puVar17 = &pZVar5[1]._blockSize + (ulong)local_508 * 6;
                lVar7 = *(long *)puVar17;
                if ((((ulong)pp_Var6[*(uint *)(lVar7 + 0x18) >> 6] >>
                      ((byte)*(uint *)(lVar7 + 0x18) & 0x3f) & 1) == 0) &&
                   (local_2f0 = lVar7, (*(byte *)(lVar7 + 0x17) & 1) == 0)) {
                  puVar17[2] = puVar17[2] | 0x1000;
                }
              }
            }
          }
          local_320 = local_4b8;
          if (*(char *)&(local_4b8->super_RAPass).super_CBPass._name != '\x12')
          goto switchD_001c0f6a_caseD_10;
          EVar13 = X86CallAlloc::run(in_stack_00000c10,in_stack_00000c08);
          if (EVar13 != 0) {
            return EVar13;
          }
          break;
        case (CBJump *)0x1:
        case (CBJump *)0x2:
          break;
        case (CBJump *)0x3:
          if (((local_4b8->super_RAPass)._heap._zone)->_end != (uint8_t *)0x0) {
            DebugUtils::assertionFailed
                      ((char *)in_stack_fffffffffffffe00,(int)((ulong)puVar19 >> 0x20),(char *)msg);
          }
          in_stack_fffffffffffffa38 = (CBLabel *)(**(code **)(*(long *)in_RDI + 0x38))();
          ((local_4b8->super_RAPass)._heap._zone)->_end = (uint8_t *)in_stack_fffffffffffffa38;
          local_2f8 = local_3e0;
          if (local_4b8 ==
              (X86RAPass *)
              (local_3e0->_zsp).super_X86Reg.super_Reg.super_Operand.super_Operand_.field_0._mem.
              field_2.offset64) goto LAB_001c0cc3;
          break;
        default:
          break;
        case (CBJump *)0x7:
          goto LAB_001c0cc3;
        case (CBJump *)0x10:
        case (CBJump *)0x13:
switchD_001c0f6a_caseD_10:
          EVar13 = X86VarAlloc::run(in_stack_000009f0,in_stack_000009e8);
          if (EVar13 != 0) {
            return EVar13;
          }
          local_2e8 = local_4b8;
          if (((ulong)(local_4b8->super_RAPass).super_CBPass._name & 0x300000) == 0) {
            if (((ulong)(local_4b8->super_RAPass).super_CBPass._name & 0x800000) != 0) {
              local_300 = local_3e0;
              EVar13 = X86RAPass_translateRet
                                 (in_stack_fffffffffffffa98,(CCFuncRet *)in_stack_fffffffffffffa90,
                                  &in_stack_fffffffffffffa88->super_CBLabel);
              if (EVar13 != 0) {
                return EVar13;
              }
              in_stack_fffffffffffffa0c = 0;
            }
          }
          else {
            local_2d8 = local_4b8;
            pXVar8 = (X86RAPass *)(local_4b8->super_RAPass)._heap._slots[4];
            if (pXVar8 == (X86RAPass *)0x0) {
              local_2c8 = local_4b8;
              if (((ulong)(local_4b8->super_RAPass).super_CBPass._name & 0x100000) != 0)
              goto LAB_001c0cc3;
            }
            else {
              local_2d0 = local_4b8;
              local_4c0 = pXVar8;
              if (((ulong)(local_4b8->super_RAPass).super_CBPass._name & 0x100000) == 0) {
                local_340 = local_4b8;
                file = (X86RAPass *)(local_4b8->super_RAPass).super_CBPass._cb;
                line = (int)((ulong)puVar19 >> 0x20);
                if (((ulong)(pXVar8->super_RAPass).super_CBPass._name & 0x10000) == 0) {
                  if (((ulong)(file->super_RAPass).super_CBPass._name & 0x10000) == 0) {
                    puVar18 = (uint8_t *)(**(code **)(*(long *)in_RDI + 0x38))();
                    ((local_4b8->super_RAPass)._heap._zone)->_end = puVar18;
                    local_2b8 = local_4b8;
                    local_298 = local_4b8;
                    if (((ulong)(local_4b8->super_RAPass).super_CBPass._name & 0x400000) == 0) {
                      local_2a8 = local_4b8;
                      local_2b0 = (X86RAPass *)(local_4b8->super_RAPass).super_CBPass._cb;
                    }
                    else {
                      local_2a0 = local_4b8;
                      local_2b0 = (X86RAPass *)(local_4b8->super_RAPass)._heap._slots[4];
                    }
                    local_4c0 = local_2b0;
                    in_stack_fffffffffffffe00 = file;
                  }
                  else {
                    local_330 = file;
                    if (*(char *)&(file->super_RAPass).super_CBPass._name != '\x04') {
                      DebugUtils::assertionFailed((char *)file,line,(char *)msg);
                    }
                    in_stack_fffffffffffffe00 = file;
                    puVar18 = (uint8_t *)(**(code **)(*(long *)in_RDI + 0x38))();
                    ((local_4b8->super_RAPass)._heap._zone)->_end = puVar18;
                    local_258 = local_3d8;
                    local_260 = local_4b8;
                    *(X86RAPass **)(local_3d8 + 0x180) = local_4b8;
                    pCVar3 = (CodeEmitter *)(file->super_RAPass)._heap._zone;
                    uVar12._0_4_ = (pCVar3->_codeInfo)._archInfo;
                    uVar12._4_4_ = (pCVar3->_codeInfo).field_1;
                    (**(code **)(*(long *)in_RDI + 0x40))(in_RDI,uVar12);
                  }
                }
                else {
                  if (((ulong)(file->super_RAPass).super_CBPass._name & 0x10000) != 0) {
                    local_328 = file;
                    if (*(char *)&(file->super_RAPass).super_CBPass._name != '\x04') {
                      DebugUtils::assertionFailed
                                ((char *)in_stack_fffffffffffffe00,line,(char *)msg);
                    }
                    local_250 = (local_4b8->super_RAPass).super_CBPass._vptr_CBPass;
                    local_248 = local_3d8;
                    *(_func_int ***)(local_3d8 + 0x180) = local_250;
                    pCVar3 = (CodeEmitter *)(pXVar8->super_RAPass)._heap._zone;
                    uVar10._0_4_ = (pCVar3->_codeInfo)._archInfo;
                    uVar10._4_4_ = (pCVar3->_codeInfo).field_1;
                    pCVar3 = (CodeEmitter *)(file->super_RAPass)._heap._zone;
                    uVar11._0_4_ = (pCVar3->_codeInfo)._archInfo;
                    uVar11._4_4_ = (pCVar3->_codeInfo).field_1;
                    (**(code **)(*(long *)in_RDI + 0x48))(in_RDI,uVar10,uVar11);
                  }
                  puVar18 = (uint8_t *)(**(code **)(*(long *)in_RDI + 0x38))();
                  ((local_4b8->super_RAPass)._heap._zone)->_end = puVar18;
                  X86RAPass_translateJump
                            (in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,
                             in_stack_fffffffffffffa38);
                  local_4c0 = file;
                }
              }
              else {
                local_390 = pXVar8;
                if (((CodeEmitter *)(pXVar8->super_RAPass)._heap._zone != (CodeEmitter *)0x0) &&
                   (pCVar3 = (CodeEmitter *)(pXVar8->super_RAPass)._heap._zone,
                   lVar7._0_4_ = (pCVar3->_codeInfo)._archInfo,
                   lVar7._4_4_ = (pCVar3->_codeInfo).field_1, lVar7 != 0)) {
                  local_240 = (local_4b8->super_RAPass).super_CBPass._vptr_CBPass;
                  local_238 = local_3d8;
                  *(_func_int ***)(local_3d8 + 0x180) = local_240;
                  pCVar3 = (CodeEmitter *)(pXVar8->super_RAPass)._heap._zone;
                  uVar9._0_4_ = (pCVar3->_codeInfo)._archInfo;
                  uVar9._4_4_ = (pCVar3->_codeInfo).field_1;
                  (**(code **)(*(long *)in_RDI + 0x40))(in_RDI,uVar9);
                  goto LAB_001c0cc3;
                }
              }
            }
          }
        }
      }
    } while (local_4c0 == pXVar2);
    local_4b8 = local_4c0;
  } while( true );
}

Assistant:

Error X86RAPass::translate() {
  X86Compiler* cc = this->cc();
  CCFunc* func = getFunc();

  // Register allocator contexts.
  X86VarAlloc vAlloc(this);
  X86CallAlloc cAlloc(this);

  // Flow.
  CBNode* node_ = func;
  CBNode* next = nullptr;
  CBNode* stop = getStop();

  ZoneList<CBNode*>::Link* jLink = _jccList.getFirst();

  for (;;) {
    while (node_->isTranslated()) {
      // Switch state if we went to a node that is already translated.
      if (node_->getType() == CBNode::kNodeLabel) {
        CBLabel* node = static_cast<CBLabel*>(node_);
        cc->_setCursor(node->getPrev());
        switchState(node->getPassData<RAData>()->state);
      }

_NextGroup:
      if (!jLink) {
        goto _Done;
      }
      else {
        node_ = jLink->getValue();
        jLink = jLink->getNext();

        CBNode* jFlow = X86RAPass_getOppositeJccFlow(static_cast<CBJump*>(node_));
        loadState(node_->getPassData<RAData>()->state);

        if (jFlow->hasPassData() && jFlow->getPassData<RAData>()->state) {
          X86RAPass_translateJump(this, static_cast<CBJump*>(node_), static_cast<CBLabel*>(jFlow));

          node_ = jFlow;
          if (node_->isTranslated())
            goto _NextGroup;
        }
        else {
          node_ = jFlow;
        }

        break;
      }
    }

    next = node_->getNext();
    node_->_flags |= CBNode::kFlagIsTranslated;

    if (node_->hasPassData()) {
      switch (node_->getType()) {
        // --------------------------------------------------------------------
        // [Align / Embed]
        // --------------------------------------------------------------------

        case CBNode::kNodeAlign:
        case CBNode::kNodeData:
          break;

        // --------------------------------------------------------------------
        // [Label]
        // --------------------------------------------------------------------

        case CBNode::kNodeLabel: {
          CBLabel* node = static_cast<CBLabel*>(node_);
          ASMJIT_ASSERT(node->getPassData<RAData>()->state == nullptr);
          node->getPassData<RAData>()->state = saveState();

          if (node == func->getExitNode())
            goto _NextGroup;
          break;
        }

        // --------------------------------------------------------------------
        // [Inst/Call/SArg/Ret]
        // --------------------------------------------------------------------

        case CBNode::kNodeInst:
        case CBNode::kNodeFunc:
        case CBNode::kNodeFuncCall:
        case CBNode::kNodePushArg:
          // Update TiedReg's unuse flags based on liveness of the next node.
          if (!node_->isJcc()) {
            X86RAData* raData = node_->getPassData<X86RAData>();
            RABits* liveness;

            if (raData && next && next->hasPassData() && (liveness = next->getPassData<RAData>()->liveness)) {
              TiedReg* tiedArray = raData->tiedArray;
              uint32_t tiedTotal = raData->tiedTotal;

              for (uint32_t i = 0; i < tiedTotal; i++) {
                TiedReg* tied = &tiedArray[i];
                VirtReg* vreg = tied->vreg;

                if (!liveness->getBit(vreg->_raId) && !vreg->isFixed())
                  tied->flags |= TiedReg::kUnuse;
              }
            }
          }

          if (node_->getType() == CBNode::kNodeFuncCall) {
            ASMJIT_PROPAGATE(cAlloc.run(static_cast<CCFuncCall*>(node_)));
            break;
          }
          ASMJIT_FALLTHROUGH;

        case CBNode::kNodeHint:
        case CBNode::kNodeFuncExit: {
          ASMJIT_PROPAGATE(vAlloc.run(node_));

          // Handle conditional/unconditional jump.
          if (node_->isJmpOrJcc()) {
            CBJump* node = static_cast<CBJump*>(node_);
            CBLabel* jTarget = node->getTarget();

            // Target not followed.
            if (!jTarget) {
              if (node->isJmp())
                goto _NextGroup;
              else
                break;
            }

            if (node->isJmp()) {
              if (jTarget->hasPassData() && jTarget->getPassData<RAData>()->state) {
                cc->_setCursor(node->getPrev());
                switchState(jTarget->getPassData<RAData>()->state);

                goto _NextGroup;
              }
              else {
                next = jTarget;
              }
            }
            else {
              CBNode* jNext = node->getNext();

              if (jTarget->isTranslated()) {
                if (jNext->isTranslated()) {
                  ASMJIT_ASSERT(jNext->getType() == CBNode::kNodeLabel);
                  cc->_setCursor(node->getPrev());
                  intersectStates(
                    jTarget->getPassData<RAData>()->state,
                    jNext->getPassData<RAData>()->state);
                }

                RAState* savedState = saveState();
                node->getPassData<RAData>()->state = savedState;

                X86RAPass_translateJump(this, node, jTarget);
                next = jNext;
              }
              else if (jNext->isTranslated()) {
                ASMJIT_ASSERT(jNext->getType() == CBNode::kNodeLabel);

                RAState* savedState = saveState();
                node->getPassData<RAData>()->state = savedState;

                cc->_setCursor(node);
                switchState(jNext->getPassData<RAData>()->state);
                next = jTarget;
              }
              else {
                node->getPassData<RAData>()->state = saveState();
                next = X86RAPass_getJccFlow(node);
              }
            }
          }
          else if (node_->isRet()) {
            ASMJIT_PROPAGATE(
              X86RAPass_translateRet(this, static_cast<CCFuncRet*>(node_), func->getExitNode()));
          }
          break;
        }

        // --------------------------------------------------------------------
        // [End]
        // --------------------------------------------------------------------

        case CBNode::kNodeSentinel: {
          goto _NextGroup;
        }

        default:
          break;
      }
    }

    if (next == stop)
      goto _NextGroup;
    node_ = next;
  }

_Done:
  {
    ASMJIT_PROPAGATE(resolveCellOffsets());
    ASMJIT_PROPAGATE(X86RAPass_prepareFuncFrame(this, func));

    FuncFrameLayout layout;
    ASMJIT_PROPAGATE(layout.init(func->getDetail(), func->getFrameInfo()));

    _varBaseRegId = layout._stackBaseRegId;
    _varBaseOffset = layout._stackBaseOffset;

    ASMJIT_PROPAGATE(X86RAPass_patchFuncMem(this, func, stop, layout));

    cc->_setCursor(func);
    ASMJIT_PROPAGATE(FuncUtils::emitProlog(this->cc(), layout));

    cc->_setCursor(func->getExitNode());
    ASMJIT_PROPAGATE(FuncUtils::emitEpilog(this->cc(), layout));
  }

  return kErrorOk;
}